

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto3.upb.h
# Opt level: O0

uint32_t protobuf_test_messages_proto3_TestAllTypesProto3_optional_uint32
                   (protobuf_test_messages_proto3_TestAllTypesProto3 *msg)

{
  bool bVar1;
  uint32_t uVar2;
  void *from;
  undefined1 local_44 [8];
  upb_MiniTableField field;
  uint32_t ret;
  uint32_t default_val;
  protobuf_test_messages_proto3_TestAllTypesProto3 *msg_local;
  uint32_t uVar3;
  
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\0';
  field.mode_dont_copy_me__upb_internal_use_only = '\0';
  local_44._0_4_ = 3;
  local_44._4_2_ = 0x10;
  local_44._6_2_ = 0;
  field.number_dont_copy_me__upb_internal_use_only = 0x420dffff;
  bVar1 = upb_MiniTableField_IsExtension((upb_MiniTableField *)local_44);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  bVar1 = upb_MiniTableField_IsInOneof((upb_MiniTableField *)local_44);
  if (((bVar1) ||
      (bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                         ((upb_MiniTableField *)local_44,
                          &field.submsg_index_dont_copy_me__upb_internal_use_only), !bVar1)) &&
     (bVar1 = upb_Message_HasBaseField
                        (&msg->base_dont_copy_me__upb_internal_use_only,
                         (upb_MiniTableField *)local_44), !bVar1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)local_44,&field.offset_dont_copy_me__upb_internal_use_only,
               &field.submsg_index_dont_copy_me__upb_internal_use_only);
    uVar3._0_2_ = field.offset_dont_copy_me__upb_internal_use_only;
    uVar3._2_2_ = field.presence;
    return uVar3;
  }
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   (&msg->base_dont_copy_me__upb_internal_use_only,(upb_MiniTableField *)local_44);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)local_44,&field.offset_dont_copy_me__upb_internal_use_only,from);
  uVar2._0_2_ = field.offset_dont_copy_me__upb_internal_use_only;
  uVar2._2_2_ = field.presence;
  return uVar2;
}

Assistant:

UPB_INLINE uint32_t protobuf_test_messages_proto3_TestAllTypesProto3_optional_uint32(const protobuf_test_messages_proto3_TestAllTypesProto3* msg) {
  uint32_t default_val = (uint32_t)0u;
  uint32_t ret;
  const upb_MiniTableField field = {3, 16, 0, kUpb_NoSub, 13, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_4Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}